

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O1

Aig_Man_t * createNewAigWith0LivePo(Aig_Man_t *pAig,Vec_Ptr_t *signalList,int *index0Live)

{
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *__s;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  Aig_Obj_t *p1;
  int iVar7;
  long lVar8;
  int iVar9;
  
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar3 = strlen(pAig->pName);
  __s = (char *)malloc(sVar3 + 7);
  p->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"0Live");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar8 = 0;
    do {
      if (pAig->vCis->nSize <= lVar8) goto LAB_005b2e95;
      pvVar1 = pAig->vCis->pArray[lVar8];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar7 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar7;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) goto LAB_005b2e95;
      pvVar1 = pAig->vCis->pArray[uVar2];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar7 = iVar7 + 1;
    } while (iVar7 < pAig->nRegs);
  }
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_005b2eb4;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pAig->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  if (pAig->nTruePos < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      if (pAig->vCos->nSize <= lVar8) goto LAB_005b2e95;
      pvVar1 = pAig->vCos->pArray[lVar8];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_005b2eb4;
      uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pAig->nTruePos);
  }
  pAVar4 = createConstrained0LiveCone(p,signalList);
  Aig_ObjCreateCo(p,pAVar4);
  *index0Live = (int)lVar8;
  iVar7 = pAig->nRegs;
  if (0 < iVar7) {
    iVar9 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar9;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_005b2e95:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_005b2eb4:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar9 = iVar9 + 1;
      iVar7 = pAig->nRegs;
    } while (iVar9 < iVar7);
  }
  Aig_ManSetRegNum(p,iVar7);
  Aig_ManCleanup(p);
  iVar7 = Aig_ManCheck(p);
  if (iVar7 == 0) {
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kLiveConstraints.c"
                  ,0x8c,"Aig_Man_t *createNewAigWith0LivePo(Aig_Man_t *, Vec_Ptr_t *, int *)");
  }
  return p;
}

Assistant:

Aig_Man_t *createNewAigWith0LivePo( Aig_Man_t *pAig, Vec_Ptr_t *signalList, int *index0Live )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjNewPoDriver;
	int i;

	//assert( Vec_PtrSize( signalList ) > 1 );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_0Live") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "0Live");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
    	}

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	pObjNewPoDriver = createConstrained0LiveCone( pNewAig, signalList );
	Aig_ObjCreateCo( pNewAig, pObjNewPoDriver );
	*index0Live = i;

	Saig_ManForEachLi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	Aig_ManSetRegNum( pNewAig, Aig_ManRegNum(pAig) );
	Aig_ManCleanup( pNewAig );

	assert( Aig_ManCheck( pNewAig ) );
	return pNewAig;
}